

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O3

char * adt_str_cstr(adt_str_t *self)

{
  adt_error_t aVar1;
  uint8_t *puVar2;
  
  if (self == (adt_str_t *)0x0) {
LAB_00107e52:
    puVar2 = (uint8_t *)0x0;
  }
  else {
    if (self->pAlloc == (uint8_t *)0x0) {
      aVar1 = adt_str_reserve(self,0);
      if (aVar1 != '\0') {
        self->lastError = aVar1;
        goto LAB_00107e52;
      }
    }
    if (self->s32Size <= self->s32Cur) {
      __assert_fail("self->s32Cur < self->s32Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                    ,0x23d,"const char *adt_str_cstr(adt_str_t *)");
    }
    if (self->pAlloc == (uint8_t *)0x0) {
      __assert_fail("self->pAlloc != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                    ,0x23e,"const char *adt_str_cstr(adt_str_t *)");
    }
    self->pAlloc[self->s32Cur] = '\0';
    puVar2 = self->pAlloc;
  }
  return (char *)puVar2;
}

Assistant:

const char* adt_str_cstr(adt_str_t *self)
{
   const char *retval = (const char*) 0;
   if(self != 0)
   {
      adt_error_t result = ADT_NO_ERROR;
      if(self->pAlloc == 0)
      {
         result = adt_str_reserve(self, 0);
      }
      if (result == ADT_NO_ERROR)
      {
         assert(self->s32Cur < self->s32Size);
         assert(self->pAlloc != 0);
         self->pAlloc[self->s32Cur] = 0u;
         retval = (const char*) self->pAlloc;
      }
      else
      {
         self->lastError = result;
      }
   }
   return retval;
}